

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

int __thiscall
opengv::point_cloud::OptimizeNonlinearFunctor1::operator()
          (OptimizeNonlinearFunctor1 *this,VectorXd *x,VectorXd *fvec)

{
  long *plVar1;
  int iVar2;
  Scalar *pSVar3;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar4;
  Scalar *pSVar5;
  long in_RDI;
  translation_t error;
  point_t transformedPoint;
  size_t i;
  Matrix<double,_4,_1,_0,_4,_1> p_hom;
  cayley_t cayley;
  transformation_t transformation;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  Indices *in_stack_fffffffffffffd10;
  DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *in_stack_fffffffffffffd18;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *this_00;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd28;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_01;
  undefined1 local_2c0 [72];
  Product<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> local_278;
  undefined1 local_220 [24];
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_208;
  cayley_t *in_stack_fffffffffffffe30;
  
  Eigen::Matrix<double,_3,_4,_0,_3,_4>::Matrix((Matrix<double,_3,_4,_0,_3,_4> *)0x324401);
  Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd18,
             (Index)in_stack_fffffffffffffd10,
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::col
            (in_stack_fffffffffffffd18,(Index)in_stack_fffffffffffffd10);
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,1,true>::operator=
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_1,_true> *)
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
             (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             in_stack_fffffffffffffd00);
  Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<3,1>
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffd18,
             (Index)in_stack_fffffffffffffd10,
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             in_stack_fffffffffffffd00);
  math::cayley2rot(in_stack_fffffffffffffe30);
  Eigen::DenseBase<Eigen::Matrix<double,3,4,0,3,4>>::block<3,3>
            (in_stack_fffffffffffffd18,(Index)in_stack_fffffffffffffd10,
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  Eigen::Block<Eigen::Matrix<double,3,4,0,3,4>,3,3,false>::operator=
            ((Block<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_3,_3,_false> *)
             CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),in_stack_fffffffffffffd00
            );
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0x3244d2);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)
                      CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                      (Index)in_stack_fffffffffffffd00);
  *pSVar3 = 1.0;
  local_208 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)0x0;
  while( true ) {
    this_01 = local_208;
    pMVar4 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             Indices::size(*(Indices **)(in_RDI + 0x10));
    if (pMVar4 <= this_01) break;
    this_00 = *(DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> **)(in_RDI + 8);
    iVar2 = Indices::operator[](in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
    (**(code **)(*(long *)this_00 + 0x18))(local_220,this_00,(long)iVar2);
    Eigen::DenseBase<Eigen::Matrix<double,4,1,0,4,1>>::block<3,1>
              (this_00,(Index)in_stack_fffffffffffffd10,
               CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    Eigen::Block<Eigen::Matrix<double,4,1,0,4,1>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_3,_1,_false> *)
               CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffd00);
    local_278 = Eigen::MatrixBase<Eigen::Matrix<double,3,4,0,3,4>>::operator*
                          ((MatrixBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)
                           CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                           (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
                           in_stack_fffffffffffffd00);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,4,0,3,4>,Eigen::Matrix<double,4,1,0,4,1>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)in_stack_fffffffffffffd00);
    plVar1 = *(long **)(in_RDI + 8);
    iVar2 = Indices::operator[](in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
    (**(code **)(*plVar1 + 0x10))(local_2c0,plVar1,(long)iVar2);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-(this_01,in_stack_fffffffffffffd28)
    ;
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_fffffffffffffd00);
    in_stack_fffffffffffffd28 =
         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                   ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffd00);
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                        (Index)in_stack_fffffffffffffd00);
    *pSVar5 = (Scalar)in_stack_fffffffffffffd28;
    local_208 = local_208 + 1;
  }
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 6 );
    assert( (unsigned int) fvec.size() == _indices.size());

    //compute the current position
    transformation_t transformation;
    transformation.col(3) = x.block<3,1>(0,0);
    cayley_t cayley = x.block<3,1>(3,0);
    transformation.block<3,3>(0,0) = math::cayley2rot(cayley);

    Eigen::Matrix<double,4,1> p_hom;
    p_hom[3] = 1.0;

    for( size_t i = 0; i < _indices.size(); i++ )
    {
      p_hom.block<3,1>(0,0) = _adapter.getPoint2(_indices[i]);
      point_t transformedPoint = transformation * p_hom;
      translation_t error = _adapter.getPoint1(_indices[i]) - transformedPoint;
      fvec[i] = error.norm();
    }

    return 0;
  }